

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O1

uint32_t helper_ssat16_arm(CPUARMState *env,uint32_t x,uint32_t shift)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  
  bVar1 = (byte)shift;
  uVar3 = (uint)(short)x;
  iVar5 = (int)uVar3 >> (bVar1 & 0x1f);
  uVar4 = -1 << (bVar1 & 0x1f);
  if (iVar5 < 1) {
    uVar2 = uVar4;
    if (iVar5 < -1) goto LAB_0059daed;
  }
  else {
    uVar2 = ~uVar4;
LAB_0059daed:
    uVar3 = uVar2;
    env->QF = 1;
  }
  uVar2 = (int)x >> 0x10;
  iVar5 = (int)uVar2 >> (bVar1 & 0x1f);
  if (iVar5 < 1) {
    if (-2 < iVar5) goto LAB_0059db1e;
  }
  else {
    uVar4 = ~uVar4;
  }
  env->QF = 1;
  uVar2 = uVar4;
LAB_0059db1e:
  return uVar2 << 0x10 | uVar3 & 0xffff;
}

Assistant:

uint32_t HELPER(ssat16)(CPUARMState *env, uint32_t x, uint32_t shift)
{
    uint32_t res;

    res = (uint16_t)do_ssat(env, (int16_t)x, shift);
    res |= do_ssat(env, ((int32_t)x) >> 16, shift) << 16;
    return res;
}